

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidyParseHTML(TidyDocImpl *doc,Node *html,GetTokenMode mode)

{
  Node **ppNVar1;
  Dict *pDVar2;
  undefined8 uVar3;
  Bool BVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node **ppNVar8;
  GetTokenMode mode_00;
  GetTokenMode extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  Node *pNVar9;
  
  prvTidySetOptionBool(doc,TidyXmlTags,no);
  pNVar5 = prvTidyGetToken(doc,IgnoreWhitespace);
  uVar3 = extraout_RDX;
  while (pNVar5 != (Node *)0x0) {
    mode_00 = (GetTokenMode)uVar3;
    pDVar2 = pNVar5->tag;
    if ((pDVar2 != (Dict *)0x0) && (pDVar2->id == TidyTag_HEAD)) goto LAB_00144c2e;
    if ((pDVar2 == html->tag) &&
       ((pNVar5->type == EndTag || ((pDVar2 == html->tag && (pNVar5->type == StartTag)))))) {
      prvTidyReport(doc,html,pNVar5,0x235);
      prvTidyFreeNode(doc,pNVar5);
    }
    else {
      BVar4 = InsertMisc(html,pNVar5);
      if (BVar4 == no) {
        prvTidyUngetToken(doc);
        break;
      }
    }
    pNVar5 = prvTidyGetToken(doc,IgnoreWhitespace);
    uVar3 = extraout_RDX_00;
  }
  pNVar5 = prvTidyInferredTag(doc,TidyTag_HEAD);
  mode_00 = extraout_EDX;
LAB_00144c2e:
  pNVar5->parent = html;
  pNVar7 = html->last;
  pNVar5->prev = pNVar7;
  ppNVar1 = &html->content;
  ppNVar8 = &pNVar7->next;
  if (pNVar7 == (Node *)0x0) {
    ppNVar8 = ppNVar1;
  }
  *ppNVar8 = pNVar5;
  html->last = pNVar5;
  prvTidyParseHead(doc,pNVar5,mode_00);
  pNVar5 = prvTidyGetToken(doc,IgnoreWhitespace);
  if (pNVar5 != (Node *)0x0) {
    pNVar6 = (Node *)0x0;
    pNVar7 = (Node *)0x0;
    do {
      pNVar9 = pNVar7;
      if (pNVar5->tag == html->tag) {
        if (pNVar7 == (Node *)0x0 && pNVar5->type != StartTag) goto LAB_00144d0b;
LAB_00144d20:
        prvTidyFreeNode(doc,pNVar5);
      }
      else {
        BVar4 = InsertMisc(html,pNVar5);
        if (BVar4 == no) {
          pDVar2 = pNVar5->tag;
          if (pDVar2 == (Dict *)0x0) {
LAB_00144df8:
            BVar4 = prvTidynodeIsElement(pNVar5);
            if (BVar4 != no) {
              pDVar2 = pNVar5->tag;
              if ((pDVar2 != (Dict *)0x0) && ((pDVar2->model & 4) != 0)) {
                MoveToHead(doc,html,pNVar5);
                goto LAB_00144eb5;
              }
              if ((pNVar7 != (Node *)0x0 && pDVar2 != (Dict *)0x0) && (pDVar2->id == TidyTag_FRAME))
              goto LAB_00144d0b;
            }
            prvTidyUngetToken(doc);
            if (pNVar7 == (Node *)0x0) {
              pNVar5 = prvTidyInferredTag(doc,TidyTag_BODY);
              if (*(int *)((doc->config).value + 6) != 1) {
                prvTidyReport(doc,html,pNVar5,0x247);
              }
LAB_00144fe9:
              prvTidyConstrainVersion(doc,0xfffffb6f);
LAB_00144ff6:
              pNVar5->parent = html;
              pNVar7 = html->last;
              pNVar5->prev = pNVar7;
              ppNVar8 = &pNVar7->next;
              if (pNVar7 == (Node *)0x0) {
                ppNVar8 = ppNVar1;
              }
              *ppNVar8 = pNVar5;
              html->last = pNVar5;
              ParseTag(doc,pNVar5,mode);
              return;
            }
            if (pNVar6 == (Node *)0x0) {
              pNVar6 = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
              pNVar6->parent = pNVar7;
              pNVar5 = pNVar7->last;
              pNVar6->prev = pNVar5;
              ppNVar8 = &pNVar5->next;
              if (pNVar5 == (Node *)0x0) {
                ppNVar8 = &pNVar7->content;
              }
              *ppNVar8 = pNVar6;
              pNVar7->last = pNVar6;
            }
            else {
              prvTidyReport(doc,html,pNVar5,0x267);
              if (pNVar6->type == StartEndTag) {
                pNVar6->type = StartTag;
              }
            }
            prvTidyConstrainVersion(doc,0x490);
            pNVar5 = pNVar6;
          }
          else {
            if (pDVar2->id != TidyTag_BODY) {
              if (pDVar2 == (Dict *)0x0) goto LAB_00144df8;
              if (pDVar2->id == TidyTag_FRAMESET) {
                if (pNVar5->type == StartTag) {
                  pNVar9 = pNVar5;
                  if (pNVar7 != (Node *)0x0) {
                    prvTidyReport(doc,html,pNVar5,0x237);
                    pNVar9 = pNVar7;
                  }
                  pNVar5->parent = html;
                  pNVar7 = html->last;
                  pNVar5->prev = pNVar7;
                  ppNVar8 = &pNVar7->next;
                  if (pNVar7 == (Node *)0x0) {
                    ppNVar8 = ppNVar1;
                  }
                  *ppNVar8 = pNVar5;
                  html->last = pNVar5;
                  ParseTag(doc,pNVar5,mode);
                  for (pNVar5 = pNVar9->content; pNVar5 != (Node *)0x0; pNVar5 = pNVar5->next) {
                    if ((pNVar5->tag != (Dict *)0x0) && (pNVar5->tag->id == TidyTag_NOFRAMES)) {
                      pNVar6 = pNVar5;
                    }
                  }
                  goto LAB_00144eb5;
                }
              }
              else {
                if ((pDVar2 == (Dict *)0x0) || (pDVar2->id != TidyTag_NOFRAMES)) goto LAB_00144df8;
                if (pNVar5->type == StartTag) {
                  if (pNVar7 == (Node *)0x0) {
                    prvTidyReport(doc,html,pNVar5,0x235);
                    prvTidyFreeNode(doc,pNVar5);
                    pNVar5 = prvTidyInferredTag(doc,TidyTag_BODY);
                    goto LAB_00144ff6;
                  }
                  if (pNVar6 == (Node *)0x0) {
                    pNVar5->parent = pNVar7;
                    pNVar6 = pNVar7->last;
                    ppNVar8 = &pNVar6->next;
                    if (pNVar6 == (Node *)0x0) {
                      ppNVar8 = &pNVar7->content;
                    }
                    pNVar5->prev = pNVar6;
                    *ppNVar8 = pNVar5;
                    pNVar7->last = pNVar5;
                  }
                  else {
                    prvTidyFreeNode(doc,pNVar5);
                    pNVar5 = pNVar6;
                  }
                  goto LAB_00144eae;
                }
              }
LAB_00144d0b:
              prvTidyReport(doc,html,pNVar5,0x235);
              goto LAB_00144d20;
            }
            if (pNVar5->type != StartTag) goto LAB_00144d0b;
            if (((doc->config).value[1].v != 0) || (pNVar7 == (Node *)0x0)) goto LAB_00144fe9;
            prvTidyUngetToken(doc);
            if (pNVar6 == (Node *)0x0) {
              pNVar5 = prvTidyInferredTag(doc,TidyTag_NOFRAMES);
              pNVar5->parent = pNVar7;
              pNVar6 = pNVar7->last;
              pNVar5->prev = pNVar6;
              ppNVar8 = &pNVar6->next;
              if (pNVar6 == (Node *)0x0) {
                ppNVar8 = &pNVar7->content;
              }
              *ppNVar8 = pNVar5;
              pNVar7->last = pNVar5;
              prvTidyReport(doc,html,pNVar5,0x247);
            }
            else {
              pNVar5 = pNVar6;
              if (pNVar6->type == StartEndTag) {
                pNVar6->type = StartTag;
              }
            }
          }
LAB_00144eae:
          ParseTag(doc,pNVar5,mode);
          pNVar6 = pNVar5;
        }
      }
LAB_00144eb5:
      pNVar5 = prvTidyGetToken(doc,IgnoreWhitespace);
      pNVar7 = pNVar9;
    } while (pNVar5 != (Node *)0x0);
    if (pNVar9 != (Node *)0x0) {
      return;
    }
  }
  pNVar7 = prvTidyInferredTag(doc,TidyTag_BODY);
  pNVar7->parent = html;
  pNVar5 = html->last;
  pNVar7->prev = pNVar5;
  ppNVar8 = &pNVar5->next;
  if (pNVar5 == (Node *)0x0) {
    ppNVar8 = ppNVar1;
  }
  *ppNVar8 = pNVar7;
  html->last = pNVar7;
  prvTidyParseBody(doc,pNVar7,(GetTokenMode)ppNVar8);
  return;
}

Assistant:

void TY_(ParseHTML)(TidyDocImpl* doc, Node *html, GetTokenMode mode)
{
    Node *node, *head;
    Node *frameset = NULL;
    Node *noframes = NULL;

    DEBUG_LOG(SPRTF("Entering ParseHTML...\n"));
    TY_(SetOptionBool)( doc, TidyXmlTags, no );

    for (;;)
    {
        node = TY_(GetToken)(doc, IgnoreWhitespace);

        if (node == NULL)
        {
            node = TY_(InferredTag)(doc, TidyTag_HEAD);
            break;
        }

        if ( nodeIsHEAD(node) )
            break;

        if (node->tag == html->tag && node->type == EndTag)
        {
            TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* find and discard multiple <html> elements */
        if (node->tag == html->tag && node->type == StartTag)
        {
            TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(html, node))
            continue;

        TY_(UngetToken)( doc );
        node = TY_(InferredTag)(doc, TidyTag_HEAD);
        break;
    }

    head = node;
    TY_(InsertNodeAtEnd)(html, head);
    TY_(ParseHead)(doc, head, mode);

    for (;;)
    {
        node = TY_(GetToken)(doc, IgnoreWhitespace);

        if (node == NULL)
        {
            if (frameset == NULL) /* implied body */
            {
                node = TY_(InferredTag)(doc, TidyTag_BODY);
                TY_(InsertNodeAtEnd)(html, node);
                TY_(ParseBody)(doc, node, mode);
            }

            DEBUG_LOG(SPRTF("Exit ParseHTML 1...\n"));
            return;
        }

        /* robustly handle html tags */
        if (node->tag == html->tag)
        {
            if (node->type != StartTag && frameset == NULL)
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);

            TY_(FreeNode)( doc, node);
            continue;
        }

        /* deal with comments etc. */
        if (InsertMisc(html, node))
            continue;

        /* if frameset document coerce <body> to <noframes> */
        if ( nodeIsBODY(node) )
        {
            if (node->type != StartTag)
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
            {
                if (frameset != NULL)
                {
                    TY_(UngetToken)( doc );

                    if (noframes == NULL)
                    {
                        noframes = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
                        TY_(InsertNodeAtEnd)(frameset, noframes);
                        TY_(Report)(doc, html, noframes, INSERTING_TAG);
                    }
                    else
                    {
                        if (noframes->type == StartEndTag)
                            noframes->type = StartTag;
                    }

                    ParseTag(doc, noframes, mode);
                    continue;
                }
            }

            TY_(ConstrainVersion)(doc, ~VERS_FRAMESET);
            break;  /* to parse body */
        }

        /* flag an error if we see more than one frameset */
        if ( nodeIsFRAMESET(node) )
        {
            if (node->type != StartTag)
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            if (frameset != NULL)
                TY_(Report)(doc, html, node, DUPLICATE_FRAMESET);
            else
                frameset = node;

            TY_(InsertNodeAtEnd)(html, node);
            ParseTag(doc, node, mode);

            /*
              see if it includes a noframes element so
              that we can merge subsequent noframes elements
            */

            for (node = frameset->content; node; node = node->next)
            {
                if ( nodeIsNOFRAMES(node) )
                    noframes = node;
            }
            continue;
        }

        /* if not a frameset document coerce <noframes> to <body> */
        if ( nodeIsNOFRAMES(node) )
        {
            if (node->type != StartTag)
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                continue;
            }

            if (frameset == NULL)
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
                node = TY_(InferredTag)(doc, TidyTag_BODY);
                break;
            }

            if (noframes == NULL)
            {
                noframes = node;
                TY_(InsertNodeAtEnd)(frameset, noframes);
            }
            else
                TY_(FreeNode)( doc, node);

            ParseTag(doc, noframes, mode);
            continue;
        }

        if (TY_(nodeIsElement)(node))
        {
            if (node->tag && node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, html, node);
                continue;
            }

            /* discard illegal frame element following a frameset */
            if ( frameset != NULL && nodeIsFRAME(node) )
            {
                TY_(Report)(doc, html, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)(doc, node);
                continue;
            }
        }

        TY_(UngetToken)( doc );

        /* insert other content into noframes element */

        if (frameset)
        {
            if (noframes == NULL)
            {
                noframes = TY_(InferredTag)(doc, TidyTag_NOFRAMES);
                TY_(InsertNodeAtEnd)(frameset, noframes);
            }
            else
            {
                TY_(Report)(doc, html, node, NOFRAMES_CONTENT);
                if (noframes->type == StartEndTag)
                    noframes->type = StartTag;
            }

            TY_(ConstrainVersion)(doc, VERS_FRAMESET);
            ParseTag(doc, noframes, mode);
            continue;
        }

        node = TY_(InferredTag)(doc, TidyTag_BODY);
        /* Issue #132 - disable inserting BODY tag warning
           BUT only if NOT --show-body-only yes */
        if (!showingBodyOnly(doc))
            TY_(Report)(doc, html, node, INSERTING_TAG );
        TY_(ConstrainVersion)(doc, ~VERS_FRAMESET);
        break;
    }

    /* node must be body */

    TY_(InsertNodeAtEnd)(html, node);
    ParseTag(doc, node, mode);
    DEBUG_LOG(SPRTF("Exit ParseHTML 2...\n"));
}